

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_ray_hit_info * rf_collision_ray_model(rf_ray ray,rf_model model)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  rf_ray ray_00;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  rf_ray_hit_info *in_RDI;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  rf_vec3 p1;
  rf_vec3 p2;
  rf_vec3 p3;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  float in_stack_00000038;
  float in_stack_0000003c;
  float in_stack_00000040;
  float in_stack_00000044;
  float in_stack_00000048;
  float in_stack_0000004c;
  long in_stack_00000060;
  rf_ray_hit_info tri_hit_info;
  rf_ray_hit_info local_50;
  
  *(undefined8 *)&(in_RDI->position).z = 0;
  (in_RDI->normal).y = 0.0;
  (in_RDI->normal).z = 0.0;
  in_RDI->hit = false;
  *(undefined3 *)&in_RDI->field_0x1 = 0;
  in_RDI->distance = 0.0;
  (in_RDI->position).x = 0.0;
  (in_RDI->position).y = 0.0;
  if (0 < in_stack_00000060) {
    lVar7 = 0;
    do {
      if (*(long *)(tri_hit_info._0_8_ + 8 + lVar7 * 0x70) != 0) {
        piVar16 = (int *)(lVar7 * 0x70 + tri_hit_info._0_8_);
        if (2 < *piVar16) {
          lVar14 = (long)(*piVar16 / 3);
          lVar15 = 0x20;
          uVar11 = 0;
          do {
            lVar5 = *(long *)(piVar16 + 2);
            lVar6 = *(long *)(piVar16 + 0xe);
            if (lVar6 == 0) {
              pfVar12 = (float *)(lVar5 + lVar15);
              puVar9 = (undefined8 *)(lVar5 + lVar15 + -0x14);
              pfVar10 = (float *)(lVar5 + lVar15 + -0xc);
              puVar13 = (undefined8 *)(lVar5 + lVar15 + -8);
              uVar8 = uVar11;
            }
            else {
              uVar8 = (ulong)*(ushort *)(lVar6 + 2 + uVar11 * 2);
              puVar9 = (undefined8 *)(lVar5 + uVar8 * 0xc);
              pfVar10 = (float *)(lVar5 + uVar8 * 0xc + 8);
              uVar8 = (ulong)*(ushort *)(lVar6 + 4 + uVar11 * 2);
              puVar13 = (undefined8 *)(lVar5 + uVar8 * 0xc);
              pfVar12 = (float *)(lVar5 + uVar8 * 0xc + 8);
              uVar8 = (ulong)*(ushort *)(lVar6 + uVar11 * 2);
            }
            fVar1 = *(float *)(lVar5 + 8 + uVar8 * 0xc);
            uVar4 = *(undefined8 *)(lVar5 + uVar8 * 0xc);
            fVar2 = *pfVar10;
            fVar3 = *pfVar12;
            fVar21 = (float)*puVar13;
            fVar22 = (float)((ulong)*puVar13 >> 0x20);
            fVar17 = (float)uVar4;
            fVar18 = (float)((ulong)uVar4 >> 0x20);
            p1.x = in_stack_00000028 * fVar1 +
                   in_stack_00000020 * fVar17 + fVar18 * in_stack_00000024 + in_stack_0000002c;
            fVar19 = (float)*puVar9;
            fVar20 = (float)((ulong)*puVar9 >> 0x20);
            p2.x = in_stack_00000028 * fVar2 +
                   in_stack_00000020 * fVar19 + fVar20 * in_stack_00000024 + in_stack_0000002c;
            p2.y = in_stack_00000038 * fVar2 +
                   in_stack_00000030 * fVar19 + fVar20 * in_stack_00000034 + in_stack_0000003c;
            p3.x = in_stack_00000028 * fVar3 +
                   in_stack_00000020 * fVar21 + fVar22 * in_stack_00000024 + in_stack_0000002c;
            p3.y = in_stack_00000038 * fVar3 +
                   in_stack_00000030 * fVar21 + fVar22 * in_stack_00000034 + in_stack_0000003c;
            p1.z = fVar1 * in_stack_00000048 +
                   fVar17 * in_stack_00000040 + fVar18 * in_stack_00000044 + in_stack_0000004c;
            p2.z = fVar2 * in_stack_00000048 +
                   fVar19 * in_stack_00000040 + fVar20 * in_stack_00000044 + in_stack_0000004c;
            p3.z = fVar3 * in_stack_00000048 +
                   fVar21 * in_stack_00000040 + fVar22 * in_stack_00000044 + in_stack_0000004c;
            ray_00._8_8_ = in_stack_00000010;
            ray_00.position._0_8_ = in_stack_00000008;
            ray_00.direction._4_8_ = in_stack_00000018;
            p1.y = in_stack_00000038 * fVar1 +
                   in_stack_00000030 * fVar17 + fVar18 * in_stack_00000034 + in_stack_0000003c;
            rf_collision_ray_triangle(&local_50,ray_00,p1,p2,p3);
            if ((local_50.hit == true) &&
               ((in_RDI->hit != true || (local_50.distance < in_RDI->distance)))) {
              *(undefined8 *)&(in_RDI->position).z = local_50._16_8_;
              (in_RDI->normal).y = local_50.normal.y;
              (in_RDI->normal).z = local_50.normal.z;
              in_RDI->hit = (_Bool)local_50.hit;
              *(int3 *)&in_RDI->field_0x1 = local_50._1_3_;
              in_RDI->distance = local_50.distance;
              (in_RDI->position).x = local_50.position.x;
              (in_RDI->position).y = local_50.position.y;
            }
            uVar11 = uVar11 + 3;
            lVar15 = lVar15 + 0x24;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != in_stack_00000060);
  }
  return in_RDI;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_model(rf_ray ray, rf_model model)
{
    rf_ray_hit_info result = {0};

    for (rf_int m = 0; m < model.mesh_count; m++)
    {
// Check if meshhas vertex data on CPU for testing
        if (model.meshes[m].vertices != NULL)
        {
// model->mesh.triangle_count may not be set, vertex_count is more reliable
            int triangle_count = model.meshes[m].vertex_count / 3;

// Test against all triangles in mesh
            for (rf_int i = 0; i < triangle_count; i++)
            {
                rf_vec3 a, b, c;
                rf_vec3 *vertdata = (rf_vec3 *) model.meshes[m].vertices;

                if (model.meshes[m].indices)
                {
                    a = vertdata[model.meshes[m].indices[i * 3 + 0]];
                    b = vertdata[model.meshes[m].indices[i * 3 + 1]];
                    c = vertdata[model.meshes[m].indices[i * 3 + 2]];
                } else
                {
                    a = vertdata[i * 3 + 0];
                    b = vertdata[i * 3 + 1];
                    c = vertdata[i * 3 + 2];
                }

                a = rf_vec3_transform(a, model.transform);
                b = rf_vec3_transform(b, model.transform);
                c = rf_vec3_transform(c, model.transform);

                rf_ray_hit_info tri_hit_info = rf_collision_ray_triangle(ray, a, b, c);

                if (tri_hit_info.hit)
                {
// Save the closest hit triangle
                    if ((!result.hit) || (result.distance > tri_hit_info.distance)) result = tri_hit_info;
                }
            }
        }
    }

    return result;
}